

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  XML_Convert_Result XVar3;
  char **ppcVar4;
  long lVar5;
  unsigned_short **ppuVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  unsigned_short *in_R8;
  char **ppcVar10;
  
  ppcVar4 = (char **)(end + -(long)ptr);
  if ((long)ppcVar4 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  pcVar7 = (char *)(ulong)bVar1;
  iVar8 = 0;
  ppcVar10 = (char **)ptr;
  iVar9 = iVar8;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (ppcVar4 != (char **)0x1) {
        XVar3 = (*enc[3].scanners[1])(enc,ptr,pcVar7,ppcVar4);
        goto LAB_004e0458;
      }
      return -2;
    }
    if (bVar1 == 6) {
      if (2 < (long)ppcVar4) {
        XVar3 = (*enc[3].scanners[2])(enc,ptr,pcVar7,ppcVar4);
        goto LAB_004e043e;
      }
      return -2;
    }
    iVar9 = 0;
    if (bVar1 == 7) {
      if ((long)ppcVar4 < 4) {
        return -2;
      }
      XVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar7,ppcVar4);
      while( true ) {
        lVar5 = 4;
        while( true ) {
          while( true ) {
            ppcVar10 = (char **)ptr;
            iVar9 = iVar8;
            if (XVar3 == XML_CONVERT_COMPLETED) goto LAB_004e0465;
LAB_004e03c2:
            while( true ) {
              ptr = (char *)((long)ptr + lVar5);
              lVar5 = (long)end - (long)ptr;
              if (lVar5 < 1) {
                return -1;
              }
              ppuVar6 = (unsigned_short **)(ulong)(byte)*ptr;
              bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar6);
              ppcVar10 = (char **)ptr;
              if (bVar1 < 0x12) break;
              lVar5 = 1;
              if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                iVar9 = iVar8;
                if (bVar1 == 0x12) {
                  ppcVar10 = (char **)((long)ptr + 1);
                  iVar9 = 9;
                }
                goto LAB_004e0465;
              }
            }
            if (bVar1 != 5) break;
            if (lVar5 == 1) {
              return -2;
            }
            XVar3 = (*enc[2].utf16Convert)(enc,(char **)ptr,(char *)(ulong)bVar1,ppuVar6,in_R8);
LAB_004e0458:
            lVar5 = 2;
          }
          if (bVar1 != 6) break;
          if (lVar5 < 3) {
            return -2;
          }
          XVar3 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_004e043e:
          lVar5 = 3;
        }
        iVar9 = iVar8;
        if (bVar1 != 7) break;
        if (lVar5 < 4) {
          return -2;
        }
        XVar3 = (*enc[3].scanners[0])(enc,ptr,(char *)(ulong)bVar1,(char **)ppuVar6);
      }
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar10 = (char **)(ptr + 1);
    if ((char **)end == ppcVar10 || (long)end - (long)ppcVar10 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar10 == 0x78) {
      ppcVar10 = (char **)(ptr + 2);
      if ((char **)end == ppcVar10 || (long)end - (long)ppcVar10 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10) & 0xfe) != 0x18)
      goto LAB_004e0465;
      ppcVar10 = (char **)(ptr + 3);
      lVar5 = (long)end - (long)ppcVar10;
      while( true ) {
        if (lVar5 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10);
        if (1 < bVar1 - 0x18) break;
        ppcVar10 = (char **)((long)ppcVar10 + 1);
        lVar5 = lVar5 + -1;
      }
      if (bVar1 != 0x12) goto LAB_004e0465;
      ppcVar4 = (char **)((long)ppcVar10 + 1);
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10) != '\x19') goto LAB_004e0465;
      lVar5 = (long)ppcVar4 + -2;
      ppcVar4 = (char **)(ptr + 2);
      do {
        ppcVar10 = ppcVar4;
        if (lVar5 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar10);
        ppcVar4 = (char **)((long)ppcVar10 + 1);
        lVar5 = lVar5 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_004e0465;
    }
    ppcVar10 = ppcVar4;
    iVar9 = 10;
  }
  else {
    lVar5 = 1;
    if (bVar1 == 0x16) goto LAB_004e03c2;
    if (bVar1 == 0x18) goto LAB_004e03c2;
  }
LAB_004e0465:
  *nextTokPtr = (char *)ppcVar10;
  return iVar9;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr)
{
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}